

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simulator.h
# Opt level: O2

void __thiscall Simulator::label(Simulator *this,PCode *code)

{
  bool bVar1;
  bool local_f9;
  string name;
  Symbol local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::__cxx11::string::string((string *)&name,(string *)&code->first_);
  std::__cxx11::string::substr((ulong)&local_d8,(ulong)&name);
  bVar1 = std::operator==(&local_d8.name_,"_begin_while_");
  std::__cxx11::string::~string((string *)&local_d8);
  if (bVar1) {
    ScopeTree::push(&this->tree_);
    local_50._M_dataplus._M_p._0_4_ = 1;
    local_f9 = true;
    Symbol::Symbol(&local_d8,&name,(int *)&local_50,&local_f9);
    ScopeTree::define(&this->tree_,&local_d8);
    Symbol::~Symbol(&local_d8);
  }
  else {
    std::__cxx11::string::substr((ulong)&local_d8,(ulong)&name);
    bVar1 = std::operator==(&local_d8.name_,"_end_while_");
    std::__cxx11::string::~string((string *)&local_d8);
    if (bVar1) {
      do {
        std::__cxx11::string::substr((ulong)&local_50,(ulong)&name);
        std::operator+(&local_d8.name_,"_begin_while_",&local_50);
        ScopeTree::resolve(&this->tree_,&local_d8.name_);
        std::__cxx11::string::~string((string *)&local_d8);
        std::__cxx11::string::~string((string *)&local_50);
        ScopeTree::pop(&this->tree_);
      } while( true );
    }
    std::__cxx11::string::substr((ulong)&local_d8,(ulong)&name);
    bVar1 = std::operator==(&local_d8.name_,"_begin_if_");
    std::__cxx11::string::~string((string *)&local_d8);
    if (!bVar1) {
      std::__cxx11::string::substr((ulong)&local_d8,(ulong)&name);
      bVar1 = std::operator==(&local_d8.name_,"_else_");
      std::__cxx11::string::~string((string *)&local_d8);
      if (!bVar1) {
        std::__cxx11::string::substr((ulong)&local_d8,(ulong)&name);
        bVar1 = std::operator==(&local_d8.name_,"_end_if_");
        std::__cxx11::string::~string((string *)&local_d8);
        if (bVar1) {
          ScopeTree::pop(&this->tree_);
        }
        goto LAB_0012974e;
      }
      ScopeTree::pop(&this->tree_);
    }
    ScopeTree::push(&this->tree_);
  }
LAB_0012974e:
  this->eip_ = this->eip_ + 1;
  std::__cxx11::string::~string((string *)&name);
  return;
}

Assistant:

void Simulator::label(const PCode &code) {
    std::string name = code.first();

    if (name.substr(0, 13) == "_begin_while_") {
        tree_.push();
        tree_.define(Symbol(name, 1, true));
    } else if (name.substr(0, 11) == "_end_while_") {
        while (true) {
            bool is_found = false;
            try {
                tree_.resolve("_begin_while_" + name.substr(11));
                tree_.pop();
                is_found = true;
            } catch (const scope_not_found &e) {
                is_found = false;
            }
            if (!is_found) {
                break;
            }
        }
    } else if (name.substr(0, 10) == "_begin_if_") {
        tree_.push();
    } else if (name.substr(0, 6) == "_else_") {
        tree_.pop();
        tree_.push();
    } else if (name.substr(0, 8) == "_end_if_") {
        tree_.pop();
    }

    inc_eip();
}